

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_checkDefaultArguments_TestShell::
~TEST_CommandLineArguments_checkDefaultArguments_TestShell
          (TEST_CommandLineArguments_checkDefaultArguments_TestShell *this)

{
  TEST_CommandLineArguments_checkDefaultArguments_TestShell *this_local;
  
  ~TEST_CommandLineArguments_checkDefaultArguments_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineArguments, checkDefaultArguments)
{
    int argc = 1;
    const char* argv[] = { "tests.exe" };
    CHECK(newArgumentParser(argc, argv));
    CHECK(!args->isVerbose());
    LONGS_EQUAL(1, args->getRepeatCount());
    CHECK(NULLPTR == args->getGroupFilters());
    CHECK(NULLPTR == args->getNameFilters());
    CHECK(args->isEclipseOutput());
    CHECK(SimpleString("") == args->getPackageName());
    CHECK(!args->isCrashingOnFail());
    CHECK(args->isRethrowingExceptions());
}